

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void sendfile_nodata_cb(uv_fs_t *req)

{
  undefined1 *puVar1;
  uint64_t uVar2;
  ssize_t sVar3;
  int iVar4;
  uint uVar5;
  __uid_t _Var6;
  uv_loop_t *puVar7;
  size_t sVar8;
  uv_fs_t *puVar9;
  uv_fs_t *puVar10;
  undefined8 uVar11;
  uv_loop_t *puVar12;
  void *pvVar13;
  uv_loop_t *unaff_RBX;
  char *pcVar14;
  uv_fs_t *puVar15;
  uv_fs_t *puVar16;
  undefined8 *puVar17;
  char *pcVar18;
  undefined8 *puVar19;
  uv_loop_t *puVar20;
  char *pcVar21;
  uv_fs_t *unaff_R14;
  uv_fs_t *puVar22;
  uv_fs_t *puVar23;
  uv_buf_t uVar24;
  undefined1 auStack_1198 [88];
  long lStack_1140;
  long lStack_1138;
  code *pcStack_fe0;
  code *pcStack_fd8;
  undefined8 uStack_fd0;
  char acStack_fc0 [88];
  char *pcStack_f68;
  uv_loop_t *puStack_e08;
  uv_fs_t *puStack_e00;
  code *pcStack_df8;
  code *pcStack_df0;
  uv_loop_t *puStack_de8;
  code *pcStack_de0;
  uv_fs_t uStack_dd8;
  uv_fs_t *puStack_c20;
  uv_fs_t *puStack_c18;
  undefined8 uStack_c10;
  uv_fs_t uStack_c00;
  undefined8 *puStack_a48;
  uv_fs_t *puStack_a40;
  code *pcStack_a38;
  code *pcStack_a30;
  undefined1 auStack_a20 [88];
  long lStack_9c8;
  uint uStack_9a8;
  code *pcStack_868;
  undefined8 uStack_860;
  uv_fs_t uStack_858;
  char *pcStack_6a0;
  uv_fs_t *puStack_698;
  uv_fs_t uStack_680;
  char *pcStack_4c8;
  uv_fs_t *puStack_4c0;
  code *pcStack_4b8;
  undefined8 uStack_4b0;
  stat64 sStack_4a0;
  uv_fs_t uStack_410;
  uv_fs_t *puStack_258;
  uv_fs_t *puStack_250;
  uv_fs_t *puStack_240;
  uv_fs_t *puStack_238;
  code *pcStack_230;
  undefined8 uStack_228;
  void *pvStack_220;
  undefined1 auStack_218 [120];
  uint64_t uStack_1a0;
  uv_loop_t *puStack_40;
  uv_fs_t *puStack_38;
  uv_loop_t *puStack_28;
  
  if (req == &sendfile_req) {
    if (sendfile_req.fs_type != UV_FS_SENDFILE) goto LAB_0015cea6;
    if (sendfile_req.result == 0) {
      sendfile_cb_count = sendfile_cb_count + 1;
      uv_fs_req_cleanup(&sendfile_req);
      return;
    }
  }
  else {
    sendfile_nodata_cb_cold_1();
LAB_0015cea6:
    sendfile_nodata_cb_cold_2();
  }
  sendfile_nodata_cb_cold_3();
  puVar7 = (uv_loop_t *)uv_default_loop();
  loop = puVar7;
  iVar4 = uv_fs_mkdtemp(puVar7,&mkdtemp_req1,"test_dir_XXXXXX",mkdtemp_cb);
  if (iVar4 == 0) {
    puVar7 = loop;
    uv_run(loop,0);
    if (mkdtemp_cb_count != 1) goto LAB_0015cfb3;
    puVar7 = (uv_loop_t *)0x0;
    iVar4 = uv_fs_mkdtemp(0,&mkdtemp_req2,"test_dir_XXXXXX",0);
    if (iVar4 != 0) goto LAB_0015cfb8;
    check_mkdtemp_result(&mkdtemp_req2);
    unaff_RBX = (uv_loop_t *)mkdtemp_req1.path;
    puVar7 = (uv_loop_t *)mkdtemp_req1.path;
    iVar4 = strcmp(mkdtemp_req1.path,mkdtemp_req2.path);
    if (iVar4 == 0) goto LAB_0015cfbd;
    rmdir((char *)unaff_RBX);
    rmdir(mkdtemp_req2.path);
    uv_fs_req_cleanup(&mkdtemp_req1);
    uv_fs_req_cleanup(&mkdtemp_req2);
    unaff_RBX = (uv_loop_t *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    puVar7 = (uv_loop_t *)uv_default_loop();
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_mkdtemp_cold_1();
LAB_0015cfb3:
    run_test_fs_mkdtemp_cold_2();
LAB_0015cfb8:
    run_test_fs_mkdtemp_cold_3();
LAB_0015cfbd:
    run_test_fs_mkdtemp_cold_5();
  }
  run_test_fs_mkdtemp_cold_4();
  if (puVar7 == (uv_loop_t *)&mkdtemp_req1) {
    check_mkdtemp_result(&mkdtemp_req1);
    mkdtemp_cb_count = mkdtemp_cb_count + 1;
    return;
  }
  mkdtemp_cb_cold_1();
  puStack_28 = unaff_RBX;
  if (puVar7->backend_fd == UV_FS_MKDTEMP) {
    if (puVar7->watcher_queue[0] != (void *)0x0) goto LAB_0015d0a5;
    unaff_R14 = (uv_fs_t *)puVar7->watchers;
    if (unaff_R14 == (uv_fs_t *)0x0) goto LAB_0015d0aa;
    puStack_38 = (uv_fs_t *)0x15d01e;
    sVar8 = strlen((char *)unaff_R14);
    if (sVar8 != 0xf) goto LAB_0015d0af;
    if ((char)unaff_R14->type != 0x5f ||
        (uv__io_t *)unaff_R14->data != (uv__io_t *)0x7269645f74736574) goto LAB_0015d0b4;
    if (*(short *)&unaff_R14->field_0xd == 0x5858 &&
        *(int *)((long)&unaff_R14->type + 1) == 0x58585858) goto LAB_0015d0b9;
    puStack_38 = (uv_fs_t *)0x15d068;
    check_permission((char *)unaff_R14,0x1c0);
    puStack_38 = (uv_fs_t *)0x15d07c;
    iVar4 = uv_fs_stat(0,&stat_req,puVar7->watchers,0);
    if (iVar4 != 0) goto LAB_0015d0be;
    if ((*(byte *)((long)stat_req.ptr + 9) & 0x40) != 0) {
      uv_fs_req_cleanup(&stat_req);
      return;
    }
  }
  else {
    puStack_38 = (uv_fs_t *)0x15d0a5;
    check_mkdtemp_result_cold_1();
    puVar7 = unaff_RBX;
LAB_0015d0a5:
    puStack_38 = (uv_fs_t *)0x15d0aa;
    check_mkdtemp_result_cold_2();
LAB_0015d0aa:
    puStack_38 = (uv_fs_t *)0x15d0af;
    check_mkdtemp_result_cold_8();
LAB_0015d0af:
    puStack_38 = (uv_fs_t *)0x15d0b4;
    check_mkdtemp_result_cold_3();
LAB_0015d0b4:
    puStack_38 = (uv_fs_t *)0x15d0b9;
    check_mkdtemp_result_cold_4();
LAB_0015d0b9:
    puStack_38 = (uv_fs_t *)0x15d0be;
    check_mkdtemp_result_cold_7();
LAB_0015d0be:
    puStack_38 = (uv_fs_t *)0x15d0c3;
    check_mkdtemp_result_cold_5();
  }
  puStack_38 = (uv_fs_t *)run_test_fs_mkstemp;
  check_mkdtemp_result_cold_6();
  puVar9 = (uv_fs_t *)auStack_218;
  auStack_218[0] = 't';
  auStack_218[1] = 'e';
  auStack_218[2] = 's';
  auStack_218[3] = 't';
  auStack_218[4] = '_';
  auStack_218[5] = 'f';
  auStack_218[6] = 'i';
  auStack_218[7] = 'l';
  auStack_218[8] = 'e';
  auStack_218[9] = '_';
  auStack_218[10] = 'X';
  auStack_218[0xb] = 'X';
  auStack_218[0xc] = 'X';
  auStack_218[0xd] = 'X';
  auStack_218[0xe] = 'X';
  auStack_218[0xf] = 'X';
  auStack_218[0x10] = 0;
  pcStack_230 = (code *)0x15d0ea;
  puStack_40 = puVar7;
  puStack_38 = unaff_R14;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_230 = (code *)0x15d10a;
  iVar4 = uv_fs_mkstemp(loop,&mkstemp_req1,puVar9,mkstemp_cb);
  if (iVar4 == 0) {
    pcStack_230 = (code *)0x15d120;
    uv_run(loop,0);
    if (mkstemp_cb_count != 1) goto LAB_0015d3d6;
    pcStack_230 = (code *)0x15d142;
    iVar4 = uv_fs_mkstemp(0,&mkstemp_req2,auStack_218,0);
    if (iVar4 < 0) goto LAB_0015d3db;
    pcStack_230 = (code *)0x15d156;
    check_mkstemp_result(&mkstemp_req2);
    pcStack_230 = (code *)0x15d169;
    iVar4 = strcmp(mkstemp_req1.path,mkstemp_req2.path);
    if (iVar4 == 0) goto LAB_0015d3e0;
    auStack_218._32_8_ = (void *)0xffffffffffffffea;
    pcStack_230 = (code *)0x15d191;
    iVar4 = uv_fs_mkstemp(0,&mkstemp_req3,"test_file",0);
    pvStack_220 = (void *)(long)iVar4;
    if ((void *)auStack_218._32_8_ != pvStack_220) goto LAB_0015d3e5;
    auStack_218._32_8_ = (void *)0x0;
    pcStack_230 = (code *)0x15d1bd;
    pvStack_220 = (void *)strlen(mkstemp_req3.path);
    if ((void *)auStack_218._32_8_ != pvStack_220) goto LAB_0015d3f4;
    pcStack_230 = (code *)0x15d1e3;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_228 = 0;
    pcVar18 = (char *)0x0;
    pcStack_230 = (code *)0x15d21f;
    iVar4 = uv_fs_write(0,auStack_218 + 0x20,(undefined4)mkstemp_req1.result,&iov,1,
                        0xffffffffffffffff);
    if (iVar4 != 0xd) goto LAB_0015d403;
    if (uStack_1a0 != 0xd) goto LAB_0015d408;
    puVar9 = (uv_fs_t *)(auStack_218 + 0x20);
    pcStack_230 = (code *)0x15d244;
    uv_fs_req_cleanup(puVar9);
    pcStack_230 = (code *)0x15d256;
    uv_fs_close(0,puVar9,(undefined4)mkstemp_req1.result,0);
    pcStack_230 = (code *)0x15d25e;
    uv_fs_req_cleanup(puVar9);
    pcStack_230 = (code *)0x15d270;
    uv_fs_close(0,puVar9,(undefined4)mkstemp_req2.result,0);
    pcStack_230 = (code *)0x15d278;
    uv_fs_req_cleanup();
    pcVar18 = (char *)0x0;
    pcStack_230 = (code *)0x15d291;
    uVar5 = uv_fs_open(0,puVar9,mkstemp_req1.path,0,0,0);
    if ((int)uVar5 < 0) goto LAB_0015d40d;
    puVar9 = (uv_fs_t *)(ulong)uVar5;
    unaff_R14 = (uv_fs_t *)(auStack_218 + 0x20);
    pcStack_230 = (code *)0x15d2a8;
    uv_fs_req_cleanup(unaff_R14);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_230 = (code *)0x15d2ca;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_228 = 0;
    pcVar18 = (char *)0x0;
    pcStack_230 = (code *)0x15d300;
    iov = uVar24;
    iVar4 = uv_fs_read(0,unaff_R14,puVar9,&iov,1,0xffffffffffffffff);
    if (iVar4 < 0) goto LAB_0015d412;
    if ((long)uStack_1a0 < 0) goto LAB_0015d417;
    pcVar18 = buf;
    pcStack_230 = (code *)0x15d32a;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_0015d41c;
    puVar1 = auStack_218 + 0x20;
    pcStack_230 = (code *)0x15d33f;
    uv_fs_req_cleanup(puVar1);
    pcStack_230 = (code *)0x15d34d;
    uv_fs_close(0,puVar1,uVar5,0);
    pcStack_230 = (code *)0x15d355;
    uv_fs_req_cleanup(puVar1);
    pcStack_230 = (code *)0x15d368;
    unlink(mkstemp_req1.path);
    unaff_R14 = &mkstemp_req2;
    pcStack_230 = (code *)0x15d37b;
    unlink(mkstemp_req2.path);
    pcStack_230 = (code *)0x15d383;
    uv_fs_req_cleanup(&mkstemp_req1);
    pcStack_230 = (code *)0x15d38b;
    uv_fs_req_cleanup(&mkstemp_req2);
    pcStack_230 = (code *)0x15d390;
    puVar9 = (uv_fs_t *)uv_default_loop();
    pcStack_230 = (code *)0x15d3a4;
    uv_walk(puVar9,close_walk_cb,0);
    pcStack_230 = (code *)0x15d3ae;
    uv_run(puVar9,0);
    pcStack_230 = (code *)0x15d3b3;
    pcVar18 = (char *)uv_default_loop();
    pcStack_230 = (code *)0x15d3bb;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      pcStack_230 = (code *)0x15d3c4;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_230 = (code *)0x15d3d6;
    run_test_fs_mkstemp_cold_1();
LAB_0015d3d6:
    pcStack_230 = (code *)0x15d3db;
    run_test_fs_mkstemp_cold_2();
LAB_0015d3db:
    pcStack_230 = (code *)0x15d3e0;
    run_test_fs_mkstemp_cold_3();
LAB_0015d3e0:
    pcStack_230 = (code *)0x15d3e5;
    run_test_fs_mkstemp_cold_13();
LAB_0015d3e5:
    pcStack_230 = (code *)0x15d3f4;
    run_test_fs_mkstemp_cold_4();
LAB_0015d3f4:
    pcVar18 = auStack_218 + 0x20;
    pcStack_230 = (code *)0x15d403;
    run_test_fs_mkstemp_cold_5();
LAB_0015d403:
    pcStack_230 = (code *)0x15d408;
    run_test_fs_mkstemp_cold_6();
LAB_0015d408:
    pcStack_230 = (code *)0x15d40d;
    run_test_fs_mkstemp_cold_7();
LAB_0015d40d:
    pcStack_230 = (code *)0x15d412;
    run_test_fs_mkstemp_cold_8();
LAB_0015d412:
    pcStack_230 = (code *)0x15d417;
    run_test_fs_mkstemp_cold_9();
LAB_0015d417:
    pcStack_230 = (code *)0x15d41c;
    run_test_fs_mkstemp_cold_10();
LAB_0015d41c:
    pcStack_230 = (code *)0x15d421;
    run_test_fs_mkstemp_cold_11();
  }
  pcStack_230 = mkstemp_cb;
  run_test_fs_mkstemp_cold_12();
  if ((uv_fs_t *)pcVar18 == &mkstemp_req1) {
    puStack_238 = (uv_fs_t *)0x15d43f;
    check_mkstemp_result(&mkstemp_req1);
    mkstemp_cb_count = mkstemp_cb_count + 1;
    return;
  }
  puStack_238 = (uv_fs_t *)check_mkstemp_result;
  mkstemp_cb_cold_1();
  puStack_240 = puVar9;
  puStack_238 = unaff_R14;
  if (((uv_fs_t *)pcVar18)->fs_type == UV_FS_MKSTEMP) {
    if (((uv_fs_t *)pcVar18)->result < 0) goto LAB_0015d503;
    puVar9 = (uv_fs_t *)((uv_fs_t *)pcVar18)->path;
    if (puVar9 == (uv_fs_t *)0x0) goto LAB_0015d508;
    puStack_250 = (uv_fs_t *)0x15d47d;
    sVar8 = strlen((char *)puVar9);
    if (sVar8 != 0x10) goto LAB_0015d50d;
    if ((short)puVar9->type != 0x5f65 || (uv__io_t *)puVar9->data != (uv__io_t *)0x6c69665f74736574)
    goto LAB_0015d512;
    if (*(short *)&puVar9->field_0xe == 0x5858 && *(int *)((long)&puVar9->type + 2) == 0x58585858)
    goto LAB_0015d517;
    puStack_250 = (uv_fs_t *)0x15d4ca;
    check_permission((char *)puVar9,0x180);
    puStack_250 = (uv_fs_t *)0x15d4de;
    iVar4 = uv_fs_stat(0,&stat_req,((uv_fs_t *)pcVar18)->path,0);
    if (iVar4 != 0) goto LAB_0015d51c;
    if ((stat_req.statbuf.st_mode._1_1_ & 0x80) != 0) {
      uv_fs_req_cleanup(&stat_req);
      return;
    }
  }
  else {
    puStack_250 = (uv_fs_t *)0x15d503;
    check_mkstemp_result_cold_1();
    pcVar18 = (char *)puVar9;
LAB_0015d503:
    puStack_250 = (uv_fs_t *)0x15d508;
    check_mkstemp_result_cold_2();
    puVar9 = unaff_R14;
LAB_0015d508:
    puStack_250 = (uv_fs_t *)0x15d50d;
    check_mkstemp_result_cold_8();
LAB_0015d50d:
    puStack_250 = (uv_fs_t *)0x15d512;
    check_mkstemp_result_cold_3();
LAB_0015d512:
    puStack_250 = (uv_fs_t *)0x15d517;
    check_mkstemp_result_cold_4();
LAB_0015d517:
    puStack_250 = (uv_fs_t *)0x15d51c;
    check_mkstemp_result_cold_7();
LAB_0015d51c:
    puStack_250 = (uv_fs_t *)0x15d521;
    check_mkstemp_result_cold_5();
  }
  puStack_250 = (uv_fs_t *)run_test_fs_fstat;
  check_mkstemp_result_cold_6();
  pcVar14 = "test_file";
  pcStack_4b8 = (code *)0x15d53f;
  puStack_258 = (uv_fs_t *)pcVar18;
  puStack_250 = puVar9;
  unlink("test_file");
  pcStack_4b8 = (code *)0x15d544;
  loop = (uv_loop_t *)uv_default_loop();
  puVar7 = (uv_loop_t *)0x0;
  pcStack_4b8 = (code *)0x15d56b;
  iVar4 = uv_fs_open(0,&uStack_410,"test_file",0x42,0x180,0);
  sVar3 = uStack_410.result;
  if (iVar4 < 0) {
    pcStack_4b8 = (code *)0x15d8d5;
    run_test_fs_fstat_cold_1();
LAB_0015d8d5:
    pcStack_4b8 = (code *)0x15d8da;
    run_test_fs_fstat_cold_2();
LAB_0015d8da:
    pcStack_4b8 = (code *)0x15d8df;
    run_test_fs_fstat_cold_3();
LAB_0015d8df:
    pcStack_4b8 = (code *)0x15d8e4;
    run_test_fs_fstat_cold_4();
LAB_0015d8e4:
    pcStack_4b8 = (code *)0x15d8e9;
    run_test_fs_fstat_cold_5();
LAB_0015d8e9:
    pcStack_4b8 = (code *)0x15d8ee;
    run_test_fs_fstat_cold_6();
LAB_0015d8ee:
    pcStack_4b8 = (code *)0x15d8f3;
    run_test_fs_fstat_cold_7();
LAB_0015d8f3:
    pcStack_4b8 = (code *)0x15d8f8;
    run_test_fs_fstat_cold_8();
LAB_0015d8f8:
    pcStack_4b8 = (code *)0x15d8fd;
    run_test_fs_fstat_cold_9();
LAB_0015d8fd:
    pcStack_4b8 = (code *)0x15d902;
    run_test_fs_fstat_cold_10();
LAB_0015d902:
    pcStack_4b8 = (code *)0x15d907;
    run_test_fs_fstat_cold_11();
LAB_0015d907:
    pcStack_4b8 = (code *)0x15d90c;
    run_test_fs_fstat_cold_12();
LAB_0015d90c:
    pcStack_4b8 = (code *)0x15d911;
    run_test_fs_fstat_cold_13();
LAB_0015d911:
    pcStack_4b8 = (code *)0x15d916;
    run_test_fs_fstat_cold_14();
LAB_0015d916:
    pcStack_4b8 = (code *)0x15d91b;
    run_test_fs_fstat_cold_15();
LAB_0015d91b:
    pcStack_4b8 = (code *)0x15d920;
    run_test_fs_fstat_cold_16();
LAB_0015d920:
    pcStack_4b8 = (code *)0x15d925;
    run_test_fs_fstat_cold_17();
LAB_0015d925:
    pcStack_4b8 = (code *)0x15d92a;
    run_test_fs_fstat_cold_18();
LAB_0015d92a:
    pcStack_4b8 = (code *)0x15d92f;
    run_test_fs_fstat_cold_19();
LAB_0015d92f:
    pcStack_4b8 = (code *)0x15d934;
    run_test_fs_fstat_cold_20();
LAB_0015d934:
    pcStack_4b8 = (code *)0x15d939;
    run_test_fs_fstat_cold_21();
LAB_0015d939:
    pcStack_4b8 = (code *)0x15d93e;
    run_test_fs_fstat_cold_22();
LAB_0015d93e:
    pcStack_4b8 = (code *)0x15d943;
    run_test_fs_fstat_cold_23();
LAB_0015d943:
    pcStack_4b8 = (code *)0x15d948;
    run_test_fs_fstat_cold_24();
LAB_0015d948:
    pcStack_4b8 = (code *)0x15d94d;
    run_test_fs_fstat_cold_25();
LAB_0015d94d:
    pcStack_4b8 = (code *)0x15d952;
    run_test_fs_fstat_cold_26();
LAB_0015d952:
    pcStack_4b8 = (code *)0x15d957;
    run_test_fs_fstat_cold_27();
LAB_0015d957:
    pcStack_4b8 = (code *)0x15d95c;
    run_test_fs_fstat_cold_28();
LAB_0015d95c:
    pcStack_4b8 = (code *)0x15d961;
    run_test_fs_fstat_cold_29();
LAB_0015d961:
    pcStack_4b8 = (code *)0x15d966;
    run_test_fs_fstat_cold_30();
LAB_0015d966:
    pcStack_4b8 = (code *)0x15d96b;
    run_test_fs_fstat_cold_31();
LAB_0015d96b:
    pcStack_4b8 = (code *)0x15d970;
    run_test_fs_fstat_cold_32();
LAB_0015d970:
    pcStack_4b8 = (code *)0x15d975;
    run_test_fs_fstat_cold_33();
LAB_0015d975:
    pcStack_4b8 = (code *)0x15d97a;
    run_test_fs_fstat_cold_34();
LAB_0015d97a:
    pcStack_4b8 = (code *)0x15d97f;
    run_test_fs_fstat_cold_35();
  }
  else {
    pcVar14 = (char *)uStack_410.result;
    if (uStack_410.result < 0) goto LAB_0015d8d5;
    pcStack_4b8 = (code *)0x15d591;
    uv_fs_req_cleanup(&uStack_410);
    puVar7 = (uv_loop_t *)(sVar3 & 0xffffffff);
    pcStack_4b8 = (code *)0x15d59d;
    iVar4 = fstat64((int)sVar3,&sStack_4a0);
    pcVar14 = (char *)sVar3;
    if (iVar4 != 0) goto LAB_0015d8da;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_4b8 = (code *)0x15d5b8;
    iVar4 = uv_fs_fstat(0,&uStack_410,sVar3 & 0xffffffff,0);
    if (iVar4 != 0) goto LAB_0015d8df;
    if ((char *)uStack_410.result != (char *)0x0) goto LAB_0015d8e4;
    uVar2 = ((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_gid;
    if ((uVar2 != 0) && (uVar2 != sStack_4a0.st_ctim.tv_sec)) goto LAB_0015d8e9;
    uVar2 = ((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_rdev;
    if ((uVar2 != 0) && (uVar2 != sStack_4a0.st_ctim.tv_nsec)) goto LAB_0015d8ee;
    pcStack_4b8 = (code *)0x15d619;
    uVar24 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_4b0 = 0;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_4b8 = (code *)0x15d654;
    iov = uVar24;
    iVar4 = uv_fs_write(0,&uStack_410,sVar3 & 0xffffffff,&iov,1,0xffffffffffffffff);
    if (iVar4 != 0xd) goto LAB_0015d8f3;
    if ((char *)uStack_410.result != (char *)0xd) goto LAB_0015d8f8;
    puVar9 = &uStack_410;
    pcStack_4b8 = (code *)0x15d67c;
    uv_fs_req_cleanup(puVar9);
    pcStack_4b8 = (code *)0x15d693;
    memset(&uStack_410.statbuf,0xaa,0xa0);
    puVar7 = (uv_loop_t *)0x0;
    pcStack_4b8 = (code *)0x15d6a1;
    iVar4 = uv_fs_fstat(0,puVar9,sVar3 & 0xffffffff,0);
    if (iVar4 != 0) goto LAB_0015d8fd;
    if ((char *)uStack_410.result != (char *)0x0) goto LAB_0015d902;
    puVar9 = (uv_fs_t *)uStack_410.ptr;
    if (((void **)((long)uStack_410.ptr + 0x10))[5] != (void *)0xd) goto LAB_0015d907;
    puVar7 = (uv_loop_t *)(sVar3 & 0xffffffff);
    pcStack_4b8 = (code *)0x15d6d7;
    iVar4 = fstat64((int)sVar3,&sStack_4a0);
    if (iVar4 != 0) goto LAB_0015d90c;
    if ((uv__io_t *)*(void **)uStack_410.ptr != (uv__io_t *)sStack_4a0.st_dev) goto LAB_0015d911;
    if (*(ulong *)((long)uStack_410.ptr + 8) != (ulong)sStack_4a0.st_mode) goto LAB_0015d916;
    if (*(void **)((long)uStack_410.ptr + 0x10) != (void *)sStack_4a0.st_nlink) goto LAB_0015d91b;
    if (((void **)((long)uStack_410.ptr + 0x10))[1] != (void *)(ulong)sStack_4a0.st_uid)
    goto LAB_0015d920;
    if (((void **)((long)uStack_410.ptr + 0x10))[2] != (void *)(ulong)sStack_4a0.st_gid)
    goto LAB_0015d925;
    if (((void **)((long)uStack_410.ptr + 0x10))[3] != (void *)sStack_4a0.st_rdev)
    goto LAB_0015d92a;
    if (((void **)((long)uStack_410.ptr + 0x10))[4] != (void *)sStack_4a0.st_ino) goto LAB_0015d92f;
    if (((void **)((long)uStack_410.ptr + 0x10))[5] != (void *)sStack_4a0.st_size)
    goto LAB_0015d934;
    if (*(long *)((long)uStack_410.ptr + 0x40) != sStack_4a0.st_blksize) goto LAB_0015d939;
    if (*(uv_loop_t **)((long)uStack_410.ptr + 0x48) != (uv_loop_t *)sStack_4a0.st_blocks)
    goto LAB_0015d93e;
    if (*(void **)((long)uStack_410.ptr + 0x60) != (void *)sStack_4a0.st_atim.tv_sec)
    goto LAB_0015d943;
    if (*(char **)((long)uStack_410.ptr + 0x68) != (char *)sStack_4a0.st_atim.tv_nsec)
    goto LAB_0015d948;
    if (((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_dev != sStack_4a0.st_mtim.tv_sec)
    goto LAB_0015d94d;
    if (((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_mode != sStack_4a0.st_mtim.tv_nsec)
    goto LAB_0015d952;
    if (((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_nlink != sStack_4a0.st_ctim.tv_sec)
    goto LAB_0015d957;
    if (((uv_stat_t *)((long)uStack_410.ptr + 0x70))->st_uid != sStack_4a0.st_ctim.tv_nsec)
    goto LAB_0015d95c;
    if (*(uv_fs_cb *)((long)uStack_410.ptr + 0x50) != (uv_fs_cb)0x0) goto LAB_0015d961;
    if (*(ssize_t *)((long)uStack_410.ptr + 0x58) != 0) goto LAB_0015d966;
    puVar9 = &uStack_410;
    pcStack_4b8 = (code *)0x15d7fa;
    uv_fs_req_cleanup(puVar9);
    pcStack_4b8 = (code *)0x15d812;
    puVar7 = loop;
    iVar4 = uv_fs_fstat(loop,puVar9,sVar3 & 0xffffffff,fstat_cb);
    if (iVar4 != 0) goto LAB_0015d96b;
    pcStack_4b8 = (code *)0x15d828;
    puVar7 = loop;
    uv_run(loop,0);
    if (fstat_cb_count != 1) goto LAB_0015d970;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_4b8 = (code *)0x15d848;
    iVar4 = uv_fs_close(0,&uStack_410,sVar3 & 0xffffffff,0);
    if (iVar4 != 0) goto LAB_0015d975;
    if ((char *)uStack_410.result != (char *)0x0) goto LAB_0015d97a;
    pcStack_4b8 = (code *)0x15d86c;
    uv_fs_req_cleanup(&uStack_410);
    pcStack_4b8 = (code *)0x15d87a;
    uv_run(loop,0);
    pcStack_4b8 = (code *)0x15d886;
    unlink("test_file");
    pcStack_4b8 = (code *)0x15d88b;
    pcVar14 = (char *)uv_default_loop();
    pcStack_4b8 = (code *)0x15d89f;
    uv_walk(pcVar14,close_walk_cb,0);
    pcStack_4b8 = (code *)0x15d8a9;
    uv_run(pcVar14,0);
    pcStack_4b8 = (code *)0x15d8ae;
    puVar7 = (uv_loop_t *)uv_default_loop();
    pcStack_4b8 = (code *)0x15d8b6;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      pcStack_4b8 = (code *)0x15d8c3;
      uv_library_shutdown();
      return;
    }
  }
  pcStack_4b8 = fstat_cb;
  run_test_fs_fstat_cold_36();
  if (puVar7->backend_fd == 8) {
    if (puVar7->watcher_queue[0] != (void *)0x0) goto LAB_0015d9af;
    if (*(long *)((long)puVar7->watcher_queue[1] + 0x38) == 0xd) {
      puStack_4c0 = (uv_fs_t *)0x15d9a2;
      uv_fs_req_cleanup();
      fstat_cb_count = fstat_cb_count + 1;
      return;
    }
  }
  else {
    puStack_4c0 = (uv_fs_t *)0x15d9af;
    fstat_cb_cold_1();
LAB_0015d9af:
    puStack_4c0 = (uv_fs_t *)0x15d9b4;
    fstat_cb_cold_2();
  }
  puStack_4c0 = (uv_fs_t *)run_test_fs_access;
  fstat_cb_cold_3();
  puVar22 = &uStack_680;
  puVar10 = &uStack_680;
  puVar15 = (uv_fs_t *)0x193537;
  pcStack_4c8 = pcVar14;
  puStack_4c0 = puVar9;
  unlink("test_file");
  rmdir("test_dir");
  loop = (uv_loop_t *)uv_default_loop();
  puVar7 = (uv_loop_t *)0x0;
  iVar4 = uv_fs_access(0,&uStack_680,"test_file",0,0);
  if (iVar4 < 0) {
    if (-1 < uStack_680.result) goto LAB_0015dc27;
    uv_fs_req_cleanup(&uStack_680);
    puVar7 = loop;
    iVar4 = uv_fs_access(loop,&uStack_680,"test_file",0,access_cb);
    puVar15 = &uStack_680;
    if (iVar4 != 0) goto LAB_0015dc2c;
    puVar7 = loop;
    uv_run(loop,0);
    puVar15 = &uStack_680;
    if (access_cb_count != 1) goto LAB_0015dc31;
    access_cb_count = 0;
    puVar7 = (uv_loop_t *)0x0;
    iVar4 = uv_fs_open(0,&uStack_680,"test_file",0x42,0x180,0);
    puVar16 = (uv_fs_t *)uStack_680.result;
    puVar15 = &uStack_680;
    if (iVar4 < 0) goto LAB_0015dc36;
    if (uStack_680.result < 0) goto LAB_0015dc3b;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    iVar4 = uv_fs_access(0,&uStack_680,"test_file",0,0);
    puVar9 = &uStack_680;
    if (iVar4 != 0) goto LAB_0015dc40;
    puVar9 = &uStack_680;
    if ((char *)uStack_680.result != (char *)0x0) goto LAB_0015dc45;
    uv_fs_req_cleanup(&uStack_680);
    puVar7 = loop;
    iVar4 = uv_fs_access(loop,&uStack_680,"test_file",0,access_cb);
    if (iVar4 != 0) goto LAB_0015dc4a;
    puVar7 = loop;
    uv_run(loop,0);
    puVar22 = &uStack_680;
    if (access_cb_count != 1) goto LAB_0015dc4f;
    access_cb_count = 0;
    puVar7 = (uv_loop_t *)0x0;
    iVar4 = uv_fs_close(0,&uStack_680,(ulong)puVar16 & 0xffffffff,0);
    puVar22 = &uStack_680;
    if (iVar4 != 0) goto LAB_0015dc54;
    puVar22 = &uStack_680;
    if ((char *)uStack_680.result != (char *)0x0) goto LAB_0015dc59;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    iVar4 = uv_fs_mkdir(0,&uStack_680,"test_dir",0x1ff,0);
    puVar16 = &uStack_680;
    puVar22 = &uStack_680;
    if (iVar4 != 0) goto LAB_0015dc5e;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    iVar4 = uv_fs_access(0,&uStack_680,"test_dir",2,0);
    puVar22 = &uStack_680;
    if (iVar4 != 0) goto LAB_0015dc63;
    puVar10 = &uStack_680;
    puVar22 = &uStack_680;
    if ((char *)uStack_680.result != (char *)0x0) goto LAB_0015dc68;
    uv_fs_req_cleanup(&uStack_680);
    uv_run(loop,0);
    unlink("test_file");
    rmdir("test_dir");
    puVar10 = (uv_fs_t *)uv_default_loop();
    uv_walk(puVar10,close_walk_cb,0);
    uv_run(puVar10,0);
    puVar7 = (uv_loop_t *)uv_default_loop();
    iVar4 = uv_loop_close();
    puVar22 = &uStack_680;
    if (iVar4 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_access_cold_1();
LAB_0015dc27:
    run_test_fs_access_cold_2();
LAB_0015dc2c:
    run_test_fs_access_cold_3();
LAB_0015dc31:
    run_test_fs_access_cold_4();
LAB_0015dc36:
    puVar16 = puVar15;
    run_test_fs_access_cold_5();
LAB_0015dc3b:
    run_test_fs_access_cold_6();
LAB_0015dc40:
    run_test_fs_access_cold_7();
LAB_0015dc45:
    puVar22 = puVar9;
    run_test_fs_access_cold_8();
LAB_0015dc4a:
    run_test_fs_access_cold_9();
LAB_0015dc4f:
    run_test_fs_access_cold_10();
LAB_0015dc54:
    run_test_fs_access_cold_11();
LAB_0015dc59:
    run_test_fs_access_cold_12();
LAB_0015dc5e:
    puVar10 = puVar16;
    run_test_fs_access_cold_13();
LAB_0015dc63:
    run_test_fs_access_cold_14();
LAB_0015dc68:
    run_test_fs_access_cold_15();
  }
  run_test_fs_access_cold_16();
  if (puVar7->backend_fd == 0xc) {
    access_cb_count = access_cb_count + 1;
    uv_fs_req_cleanup();
    return;
  }
  access_cb_cold_1();
  pcVar18 = "test_file";
  pcStack_868 = (code *)0x15dca4;
  pcStack_6a0 = (char *)puVar10;
  puStack_698 = puVar22;
  unlink("test_file");
  pcStack_868 = (code *)0x15dca9;
  loop = (uv_loop_t *)uv_default_loop();
  puVar9 = &uStack_858;
  puVar7 = (uv_loop_t *)0x0;
  pcStack_868 = (code *)0x15dccd;
  iVar4 = uv_fs_open(0,puVar9,"test_file",0x42,0x180,0);
  sVar3 = uStack_858.result;
  if (iVar4 < 0) {
    pcStack_868 = (code *)0x15dfa5;
    run_test_fs_chmod_cold_1();
LAB_0015dfa5:
    pcStack_868 = (code *)0x15dfaa;
    run_test_fs_chmod_cold_2();
LAB_0015dfaa:
    pcStack_868 = (code *)0x15dfaf;
    run_test_fs_chmod_cold_3();
LAB_0015dfaf:
    pcStack_868 = (code *)0x15dfb4;
    run_test_fs_chmod_cold_4();
LAB_0015dfb4:
    pcStack_868 = (code *)0x15dfb9;
    run_test_fs_chmod_cold_5();
LAB_0015dfb9:
    pcStack_868 = (code *)0x15dfbe;
    run_test_fs_chmod_cold_6();
LAB_0015dfbe:
    pcStack_868 = (code *)0x15dfc3;
    run_test_fs_chmod_cold_7();
LAB_0015dfc3:
    pcStack_868 = (code *)0x15dfc8;
    run_test_fs_chmod_cold_8();
LAB_0015dfc8:
    pcStack_868 = (code *)0x15dfcd;
    run_test_fs_chmod_cold_9();
LAB_0015dfcd:
    pcStack_868 = (code *)0x15dfd2;
    run_test_fs_chmod_cold_10();
LAB_0015dfd2:
    pcStack_868 = (code *)0x15dfd7;
    run_test_fs_chmod_cold_11();
LAB_0015dfd7:
    pcStack_868 = (code *)0x15dfdc;
    run_test_fs_chmod_cold_12();
LAB_0015dfdc:
    pcStack_868 = (code *)0x15dfe1;
    run_test_fs_chmod_cold_13();
LAB_0015dfe1:
    pcStack_868 = (code *)0x15dfe6;
    run_test_fs_chmod_cold_14();
LAB_0015dfe6:
    pcStack_868 = (code *)0x15dfeb;
    run_test_fs_chmod_cold_15();
LAB_0015dfeb:
    pcStack_868 = (code *)0x15dff0;
    run_test_fs_chmod_cold_16();
  }
  else {
    pcVar18 = (char *)uStack_858.result;
    if (uStack_858.result < 0) goto LAB_0015dfa5;
    puVar22 = &uStack_858;
    pcStack_868 = (code *)0x15dcf0;
    uv_fs_req_cleanup(puVar22);
    pcStack_868 = (code *)0x15dd01;
    uVar24 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_860 = 0;
    puVar7 = (uv_loop_t *)0x0;
    pcStack_868 = (code *)0x15dd37;
    puVar9 = puVar22;
    iov = uVar24;
    iVar4 = uv_fs_write(0,puVar22,sVar3 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar18 = (char *)sVar3;
    if (iVar4 != 0xd) goto LAB_0015dfaa;
    if ((char *)uStack_858.result != (char *)0xd) goto LAB_0015dfaf;
    puVar22 = &uStack_858;
    pcStack_868 = (code *)0x15dd59;
    uv_fs_req_cleanup();
    puVar7 = (uv_loop_t *)0x0;
    pcStack_868 = (code *)0x15dd72;
    puVar9 = puVar22;
    iVar4 = uv_fs_chmod(0,puVar22,"test_file",0x80,0);
    if (iVar4 != 0) goto LAB_0015dfb4;
    if ((char *)uStack_858.result != (char *)0x0) goto LAB_0015dfb9;
    puVar22 = &uStack_858;
    pcStack_868 = (code *)0x15dd93;
    uv_fs_req_cleanup(puVar22);
    pcStack_868 = (code *)0x15dda7;
    check_permission("test_file",0x80);
    puVar7 = (uv_loop_t *)0x0;
    pcStack_868 = (code *)0x15ddbc;
    puVar9 = puVar22;
    iVar4 = uv_fs_chmod(0,puVar22,"test_file",0x100,0);
    if (iVar4 != 0) goto LAB_0015dfbe;
    if ((char *)uStack_858.result != (char *)0x0) goto LAB_0015dfc3;
    puVar22 = &uStack_858;
    pcStack_868 = (code *)0x15dddd;
    uv_fs_req_cleanup(puVar22);
    pcStack_868 = (code *)0x15ddee;
    check_permission("test_file",0x100);
    puVar7 = (uv_loop_t *)0x0;
    pcStack_868 = (code *)0x15de02;
    puVar9 = puVar22;
    iVar4 = uv_fs_fchmod(0,puVar22,sVar3 & 0xffffffff,0x180,0);
    if (iVar4 != 0) goto LAB_0015dfc8;
    if ((char *)uStack_858.result != (char *)0x0) goto LAB_0015dfcd;
    puVar22 = &uStack_858;
    pcStack_868 = (code *)0x15de23;
    uv_fs_req_cleanup(puVar22);
    pcStack_868 = (code *)0x15de37;
    check_permission("test_file",0x180);
    uStack_858.data = &run_test_fs_chmod::mode;
    pcStack_868 = (code *)0x15de5f;
    puVar9 = puVar22;
    puVar7 = loop;
    iVar4 = uv_fs_chmod(loop,puVar22,"test_file",0x80,chmod_cb);
    if (iVar4 != 0) goto LAB_0015dfd2;
    puVar9 = (uv_fs_t *)0x0;
    pcStack_868 = (code *)0x15de75;
    puVar7 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_0015dfd7;
    chmod_cb_count = 0;
    puVar9 = &uStack_858;
    uStack_858.data = &run_test_fs_chmod::mode_1;
    pcStack_868 = (code *)0x15deba;
    puVar7 = loop;
    iVar4 = uv_fs_chmod(loop,puVar9,"test_file",0x100,chmod_cb);
    if (iVar4 != 0) goto LAB_0015dfdc;
    puVar9 = (uv_fs_t *)0x0;
    pcStack_868 = (code *)0x15ded0;
    puVar7 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_0015dfe1;
    puVar9 = &uStack_858;
    uStack_858.data = &run_test_fs_chmod::mode_2;
    pcStack_868 = (code *)0x15df06;
    puVar7 = loop;
    iVar4 = uv_fs_fchmod(loop,puVar9,sVar3 & 0xffffffff,0x180,fchmod_cb);
    if (iVar4 != 0) goto LAB_0015dfe6;
    puVar9 = (uv_fs_t *)0x0;
    pcStack_868 = (code *)0x15df1c;
    puVar7 = loop;
    uv_run();
    if (fchmod_cb_count != 1) goto LAB_0015dfeb;
    pcStack_868 = (code *)0x15df3e;
    uv_fs_close(loop,&uStack_858,sVar3 & 0xffffffff,0);
    pcStack_868 = (code *)0x15df4c;
    uv_run(loop,0);
    pcStack_868 = (code *)0x15df58;
    unlink("test_file");
    pcStack_868 = (code *)0x15df5d;
    pcVar18 = (char *)uv_default_loop();
    pcStack_868 = (code *)0x15df71;
    uv_walk(pcVar18,close_walk_cb,0);
    puVar9 = (uv_fs_t *)0x0;
    pcStack_868 = (code *)0x15df7b;
    uv_run(pcVar18);
    pcStack_868 = (code *)0x15df80;
    puVar7 = (uv_loop_t *)uv_default_loop();
    pcStack_868 = (code *)0x15df88;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      pcStack_868 = (code *)0x15df91;
      uv_library_shutdown();
      return;
    }
  }
  pcStack_868 = check_permission;
  run_test_fs_chmod_cold_17();
  puVar17 = (undefined8 *)((ulong)puVar9 & 0xffffffff);
  puVar19 = (undefined8 *)0x0;
  pcStack_a30 = (code *)0x15e010;
  pcStack_868 = (code *)pcVar18;
  iVar4 = uv_fs_stat(0,auStack_a20,puVar7,0);
  if (iVar4 == 0) {
    if (lStack_9c8 != 0) goto LAB_0015e044;
    if ((uStack_9a8 & 0x1ff) == (uint)puVar9) {
      pcStack_a30 = (code *)0x15e036;
      uv_fs_req_cleanup(auStack_a20);
      return;
    }
  }
  else {
    pcStack_a30 = (code *)0x15e044;
    check_permission_cold_1();
LAB_0015e044:
    pcStack_a30 = (code *)0x15e049;
    check_permission_cold_2();
  }
  pcStack_a30 = chmod_cb;
  check_permission_cold_3();
  pcStack_a30 = (code *)puVar17;
  if (*(int *)(puVar19 + 8) == 0xd) {
    puVar17 = puVar19;
    if (puVar19[0xb] == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      pcStack_a38 = (code *)0x15e06d;
      uv_fs_req_cleanup(puVar19);
      check_permission("test_file",*(uint *)*puVar19);
      return;
    }
  }
  else {
    pcStack_a38 = (code *)0x15e084;
    chmod_cb_cold_1();
  }
  pcStack_a38 = fchmod_cb;
  chmod_cb_cold_2();
  pcStack_a38 = (code *)puVar17;
  if (*(int *)(puVar19 + 8) == 0xe) {
    puStack_a48 = puVar19;
    if (puVar19[0xb] == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      puStack_a40 = (uv_fs_t *)0x15e0a8;
      uv_fs_req_cleanup(puVar19);
      check_permission("test_file",*(uint *)*puVar19);
      return;
    }
  }
  else {
    puStack_a40 = (uv_fs_t *)0x15e0bf;
    fchmod_cb_cold_1();
    puStack_a48 = puVar17;
  }
  puStack_a40 = (uv_fs_t *)run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  puVar9 = (uv_fs_t *)0x193537;
  puStack_c18 = (uv_fs_t *)0x15e0dd;
  puStack_a40 = puVar22;
  unlink("test_file");
  puStack_c18 = (uv_fs_t *)0x15e0e2;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_c18 = (uv_fs_t *)0x15e106;
  iVar4 = uv_fs_open(0,&uStack_c00,"test_file",0x42,0x180,0);
  sVar3 = uStack_c00.result;
  if (iVar4 < 0) {
    puStack_c18 = (uv_fs_t *)0x15e2a8;
    run_test_fs_unlink_readonly_cold_1();
LAB_0015e2a8:
    puStack_c18 = (uv_fs_t *)0x15e2ad;
    run_test_fs_unlink_readonly_cold_2();
LAB_0015e2ad:
    puStack_c18 = (uv_fs_t *)0x15e2b2;
    run_test_fs_unlink_readonly_cold_3();
LAB_0015e2b2:
    puStack_c18 = (uv_fs_t *)0x15e2b7;
    run_test_fs_unlink_readonly_cold_4();
LAB_0015e2b7:
    puStack_c18 = (uv_fs_t *)0x15e2bc;
    run_test_fs_unlink_readonly_cold_5();
LAB_0015e2bc:
    puStack_c18 = (uv_fs_t *)0x15e2c1;
    run_test_fs_unlink_readonly_cold_6();
LAB_0015e2c1:
    puStack_c18 = (uv_fs_t *)0x15e2c6;
    run_test_fs_unlink_readonly_cold_7();
LAB_0015e2c6:
    puStack_c18 = (uv_fs_t *)0x15e2cb;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    puVar9 = (uv_fs_t *)uStack_c00.result;
    if (uStack_c00.result < 0) goto LAB_0015e2a8;
    puVar22 = &uStack_c00;
    puStack_c18 = (uv_fs_t *)0x15e129;
    uv_fs_req_cleanup(puVar22);
    puStack_c18 = (uv_fs_t *)0x15e13a;
    uVar24 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_c10 = 0;
    puStack_c18 = (uv_fs_t *)0x15e170;
    iov = uVar24;
    iVar4 = uv_fs_write(0,puVar22,sVar3 & 0xffffffff,&iov,1,0xffffffffffffffff);
    puVar9 = (uv_fs_t *)sVar3;
    if (iVar4 != 0xd) goto LAB_0015e2ad;
    if ((uv_fs_t *)uStack_c00.result != (uv_fs_t *)0xd) goto LAB_0015e2b2;
    puVar22 = &uStack_c00;
    puStack_c18 = (uv_fs_t *)0x15e192;
    uv_fs_req_cleanup(puVar22);
    puStack_c18 = (uv_fs_t *)0x15e1a5;
    uv_fs_close(loop,puVar22,sVar3 & 0xffffffff,0);
    puStack_c18 = (uv_fs_t *)0x15e1be;
    iVar4 = uv_fs_chmod(0,puVar22,"test_file",0x100,0);
    if (iVar4 != 0) goto LAB_0015e2b7;
    if ((uv_fs_t *)uStack_c00.result != (uv_fs_t *)0x0) goto LAB_0015e2bc;
    puVar9 = &uStack_c00;
    puStack_c18 = (uv_fs_t *)0x15e1df;
    uv_fs_req_cleanup(puVar9);
    puVar22 = (uv_fs_t *)0x193537;
    puStack_c18 = (uv_fs_t *)0x15e1f3;
    check_permission("test_file",0x100);
    puStack_c18 = (uv_fs_t *)0x15e202;
    iVar4 = uv_fs_unlink(0,puVar9,"test_file",0);
    if (iVar4 != 0) goto LAB_0015e2c1;
    if ((uv_fs_t *)uStack_c00.result != (uv_fs_t *)0x0) goto LAB_0015e2c6;
    puStack_c18 = (uv_fs_t *)0x15e223;
    uv_fs_req_cleanup(&uStack_c00);
    puStack_c18 = (uv_fs_t *)0x15e231;
    uv_run(loop,0);
    puVar22 = (uv_fs_t *)0x193537;
    puStack_c18 = (uv_fs_t *)0x15e24d;
    uv_fs_chmod(0,&uStack_c00,"test_file",0x180,0);
    puStack_c18 = (uv_fs_t *)0x15e255;
    uv_fs_req_cleanup(&uStack_c00);
    puStack_c18 = (uv_fs_t *)0x15e25d;
    unlink("test_file");
    puStack_c18 = (uv_fs_t *)0x15e262;
    puVar9 = (uv_fs_t *)uv_default_loop();
    puStack_c18 = (uv_fs_t *)0x15e276;
    uv_walk(puVar9,close_walk_cb,0);
    puStack_c18 = (uv_fs_t *)0x15e280;
    uv_run(puVar9,0);
    puStack_c18 = (uv_fs_t *)0x15e285;
    uVar11 = uv_default_loop();
    puStack_c18 = (uv_fs_t *)0x15e28d;
    iVar4 = uv_loop_close(uVar11);
    if (iVar4 == 0) {
      puStack_c18 = (uv_fs_t *)0x15e296;
      uv_library_shutdown();
      return;
    }
  }
  puStack_c18 = (uv_fs_t *)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  puVar23 = &uStack_dd8;
  puVar16 = &uStack_dd8;
  puVar15 = &uStack_dd8;
  puVar10 = &uStack_dd8;
  puVar7 = (uv_loop_t *)0x193537;
  pcStack_de0 = (code *)0x15e2e9;
  puStack_c20 = puVar9;
  puStack_c18 = puVar22;
  unlink("test_file");
  pcStack_de0 = (code *)0x15e2f5;
  unlink("test_file_link");
  pcStack_de0 = (code *)0x15e2fa;
  loop = (uv_loop_t *)uv_default_loop();
  puVar12 = (uv_loop_t *)0x0;
  pcStack_de0 = (code *)0x15e31c;
  iVar4 = uv_fs_open(0,&uStack_dd8,"test_file",0x42,0x180,0);
  sVar3 = uStack_dd8.result;
  if (iVar4 < 0) {
    pcStack_de0 = (code *)0x15e5f2;
    run_test_fs_chown_cold_1();
LAB_0015e5f2:
    pcStack_de0 = (code *)0x15e5f7;
    run_test_fs_chown_cold_2();
LAB_0015e5f7:
    pcStack_de0 = (code *)0x15e5fc;
    run_test_fs_chown_cold_3();
LAB_0015e5fc:
    puVar23 = puVar22;
    pcStack_de0 = (code *)0x15e601;
    run_test_fs_chown_cold_4();
LAB_0015e601:
    pcStack_de0 = (code *)0x15e606;
    run_test_fs_chown_cold_5();
LAB_0015e606:
    puVar16 = puVar23;
    pcStack_de0 = (code *)0x15e60b;
    run_test_fs_chown_cold_6();
LAB_0015e60b:
    pcStack_de0 = (code *)0x15e610;
    run_test_fs_chown_cold_7();
LAB_0015e610:
    pcStack_de0 = (code *)0x15e615;
    run_test_fs_chown_cold_8();
LAB_0015e615:
    pcStack_de0 = (code *)0x15e61a;
    run_test_fs_chown_cold_9();
LAB_0015e61a:
    pcStack_de0 = (code *)0x15e61f;
    run_test_fs_chown_cold_10();
LAB_0015e61f:
    pcStack_de0 = (code *)0x15e624;
    run_test_fs_chown_cold_11();
LAB_0015e624:
    pcStack_de0 = (code *)0x15e629;
    run_test_fs_chown_cold_12();
LAB_0015e629:
    pcStack_de0 = (code *)0x15e62e;
    run_test_fs_chown_cold_13();
LAB_0015e62e:
    puVar15 = puVar16;
    pcStack_de0 = (code *)0x15e633;
    run_test_fs_chown_cold_14();
LAB_0015e633:
    pcStack_de0 = (code *)0x15e638;
    run_test_fs_chown_cold_15();
LAB_0015e638:
    puVar10 = puVar15;
    pcStack_de0 = (code *)0x15e63d;
    run_test_fs_chown_cold_16();
LAB_0015e63d:
    pcStack_de0 = (code *)0x15e642;
    run_test_fs_chown_cold_17();
LAB_0015e642:
    pcStack_de0 = (code *)0x15e647;
    run_test_fs_chown_cold_18();
LAB_0015e647:
    pcStack_de0 = (code *)0x15e64c;
    run_test_fs_chown_cold_19();
LAB_0015e64c:
    pcStack_de0 = (code *)0x15e651;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar7 = (uv_loop_t *)uStack_dd8.result;
    if (uStack_dd8.result < 0) goto LAB_0015e5f2;
    pcStack_de0 = (code *)0x15e33d;
    uv_fs_req_cleanup();
    puVar12 = (uv_loop_t *)0x0;
    pcStack_de0 = (code *)0x15e35c;
    iVar4 = uv_fs_chown(0,&uStack_dd8,"test_file",0xffffffff,0xffffffff,0);
    puVar7 = (uv_loop_t *)sVar3;
    puVar22 = &uStack_dd8;
    if (iVar4 != 0) goto LAB_0015e5f7;
    puVar22 = &uStack_dd8;
    if ((uv_loop_t *)uStack_dd8.result != (uv_loop_t *)0x0) goto LAB_0015e5fc;
    pcStack_de0 = (code *)0x15e37b;
    uv_fs_req_cleanup();
    puVar12 = (uv_loop_t *)0x0;
    pcStack_de0 = (code *)0x15e395;
    iVar4 = uv_fs_fchown(0,&uStack_dd8,sVar3 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar4 != 0) goto LAB_0015e601;
    puVar23 = &uStack_dd8;
    if ((uv_loop_t *)uStack_dd8.result != (uv_loop_t *)0x0) goto LAB_0015e606;
    pcStack_de0 = (code *)0x15e3b4;
    uv_fs_req_cleanup(&uStack_dd8);
    pcStack_de0 = (code *)0x15e3dc;
    puVar12 = loop;
    iVar4 = uv_fs_chown(loop,&uStack_dd8,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar4 != 0) goto LAB_0015e60b;
    pcStack_de0 = (code *)0x15e3f2;
    puVar12 = loop;
    uv_run(loop,0);
    puVar16 = &uStack_dd8;
    if (chown_cb_count != 1) goto LAB_0015e610;
    chown_cb_count = 0;
    pcStack_de0 = (code *)0x15e42b;
    puVar12 = loop;
    iVar4 = uv_fs_chown(loop,&uStack_dd8,"test_file",0,0,chown_root_cb);
    puVar16 = &uStack_dd8;
    if (iVar4 != 0) goto LAB_0015e615;
    pcStack_de0 = (code *)0x15e441;
    puVar12 = loop;
    uv_run(loop,0);
    puVar16 = &uStack_dd8;
    if (chown_cb_count != 1) goto LAB_0015e61a;
    pcStack_de0 = (code *)0x15e471;
    puVar12 = loop;
    iVar4 = uv_fs_fchown(loop,&uStack_dd8,sVar3 & 0xffffffff,0xffffffff,0xffffffff,fchown_cb);
    puVar16 = &uStack_dd8;
    if (iVar4 != 0) goto LAB_0015e61f;
    pcStack_de0 = (code *)0x15e487;
    puVar12 = loop;
    uv_run(loop,0);
    puVar16 = &uStack_dd8;
    if (fchown_cb_count != 1) goto LAB_0015e624;
    puVar12 = (uv_loop_t *)0x0;
    pcStack_de0 = (code *)0x15e4af;
    iVar4 = uv_fs_link(0,&uStack_dd8,"test_file","test_file_link",0);
    puVar16 = &uStack_dd8;
    if (iVar4 != 0) goto LAB_0015e629;
    puVar16 = &uStack_dd8;
    if ((uv_loop_t *)uStack_dd8.result != (uv_loop_t *)0x0) goto LAB_0015e62e;
    pcStack_de0 = (code *)0x15e4ce;
    uv_fs_req_cleanup();
    puVar12 = (uv_loop_t *)0x0;
    pcStack_de0 = (code *)0x15e4ed;
    iVar4 = uv_fs_lchown(0,&uStack_dd8,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar4 != 0) goto LAB_0015e633;
    puVar15 = &uStack_dd8;
    if ((uv_loop_t *)uStack_dd8.result != (uv_loop_t *)0x0) goto LAB_0015e638;
    pcStack_de0 = (code *)0x15e50c;
    uv_fs_req_cleanup(&uStack_dd8);
    pcStack_de0 = (code *)0x15e534;
    puVar12 = loop;
    iVar4 = uv_fs_lchown(loop,&uStack_dd8,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar4 != 0) goto LAB_0015e63d;
    pcStack_de0 = (code *)0x15e54a;
    puVar12 = loop;
    uv_run(loop,0);
    puVar10 = &uStack_dd8;
    if (lchown_cb_count != 1) goto LAB_0015e642;
    puVar12 = (uv_loop_t *)0x0;
    pcStack_de0 = (code *)0x15e565;
    iVar4 = uv_fs_close(0,&uStack_dd8,sVar3 & 0xffffffff,0);
    puVar10 = &uStack_dd8;
    if (iVar4 != 0) goto LAB_0015e647;
    puVar10 = &uStack_dd8;
    if ((uv_loop_t *)uStack_dd8.result != (uv_loop_t *)0x0) goto LAB_0015e64c;
    pcStack_de0 = (code *)0x15e581;
    uv_fs_req_cleanup(&uStack_dd8);
    pcStack_de0 = (code *)0x15e58f;
    uv_run(loop,0);
    pcStack_de0 = (code *)0x15e59b;
    unlink("test_file");
    pcStack_de0 = (code *)0x15e5a7;
    unlink("test_file_link");
    pcStack_de0 = (code *)0x15e5ac;
    puVar7 = (uv_loop_t *)uv_default_loop();
    pcStack_de0 = (code *)0x15e5c0;
    uv_walk(puVar7,close_walk_cb,0);
    pcStack_de0 = (code *)0x15e5ca;
    uv_run(puVar7,0);
    pcStack_de0 = (code *)0x15e5cf;
    puVar12 = (uv_loop_t *)uv_default_loop();
    pcStack_de0 = (code *)0x15e5d7;
    iVar4 = uv_loop_close();
    puVar10 = &uStack_dd8;
    if (iVar4 == 0) {
      pcStack_de0 = (code *)0x15e5e0;
      uv_library_shutdown();
      return;
    }
  }
  pcStack_de0 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar12->backend_fd == 0x1a) {
    if (puVar12->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    puStack_de8 = (uv_loop_t *)0x15e675;
    chown_cb_cold_1();
  }
  puStack_de8 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_de8 = puVar7;
  if (puVar12->backend_fd == 0x1a) {
    pcStack_df0 = (code *)0x15e689;
    puVar20 = puVar12;
    _Var6 = geteuid();
    pvVar13 = puVar12->watcher_queue[0];
    if (_Var6 != 0) {
      if (pvVar13 == (void *)0xffffffffffffffff) goto LAB_0015e6a1;
      pcStack_df0 = (code *)0x15e69c;
      chown_root_cb_cold_2();
    }
    puVar7 = puVar12;
    if (pvVar13 == (void *)0x0) {
LAB_0015e6a1:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup(puVar12);
      return;
    }
  }
  else {
    pcStack_df0 = (code *)0x15e6b5;
    chown_root_cb_cold_1();
    puVar20 = puVar12;
  }
  pcStack_df0 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar20->backend_fd == 0x1b) {
    if (puVar20->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_df8 = (code *)0x15e6d9;
    fchown_cb_cold_1();
  }
  pcStack_df8 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar20->backend_fd == 0x1e) {
    if (puVar20->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    puStack_e00 = (uv_fs_t *)0x15e6fd;
    lchown_cb_cold_1();
  }
  puStack_e00 = (uv_fs_t *)run_test_fs_link;
  lchown_cb_cold_2();
  pcVar14 = "test_file";
  pcStack_fd8 = (code *)0x15e71b;
  puStack_e08 = puVar7;
  puStack_e00 = puVar10;
  unlink("test_file");
  pcStack_fd8 = (code *)0x15e727;
  unlink("test_file_link");
  pcStack_fd8 = (code *)0x15e733;
  unlink("test_file_link2");
  pcStack_fd8 = (code *)0x15e738;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar21 = (char *)0x0;
  pcStack_fd8 = (code *)0x15e75c;
  iVar4 = uv_fs_open(0,acStack_fc0,"test_file",0x42,0x180,0);
  pcVar18 = pcStack_f68;
  if (iVar4 < 0) {
    pcStack_fd8 = (code *)0x15ea9f;
    run_test_fs_link_cold_1();
LAB_0015ea9f:
    pcStack_fd8 = (code *)0x15eaa4;
    run_test_fs_link_cold_2();
LAB_0015eaa4:
    pcStack_fd8 = (code *)0x15eaa9;
    run_test_fs_link_cold_3();
LAB_0015eaa9:
    pcStack_fd8 = (code *)0x15eaae;
    run_test_fs_link_cold_4();
LAB_0015eaae:
    pcStack_fd8 = (code *)0x15eab3;
    run_test_fs_link_cold_5();
LAB_0015eab3:
    pcStack_fd8 = (code *)0x15eab8;
    run_test_fs_link_cold_6();
LAB_0015eab8:
    pcVar18 = pcVar14;
    pcStack_fd8 = (code *)0x15eabd;
    run_test_fs_link_cold_7();
LAB_0015eabd:
    pcStack_fd8 = (code *)0x15eac2;
    run_test_fs_link_cold_8();
LAB_0015eac2:
    pcStack_fd8 = (code *)0x15eac7;
    run_test_fs_link_cold_9();
LAB_0015eac7:
    pcStack_fd8 = (code *)0x15eacc;
    run_test_fs_link_cold_10();
LAB_0015eacc:
    pcStack_fd8 = (code *)0x15ead1;
    run_test_fs_link_cold_11();
LAB_0015ead1:
    pcStack_fd8 = (code *)0x15ead6;
    run_test_fs_link_cold_12();
LAB_0015ead6:
    pcStack_fd8 = (code *)0x15eadb;
    run_test_fs_link_cold_13();
LAB_0015eadb:
    pcVar14 = pcVar18;
    pcStack_fd8 = (code *)0x15eae0;
    run_test_fs_link_cold_14();
LAB_0015eae0:
    pcStack_fd8 = (code *)0x15eae5;
    run_test_fs_link_cold_15();
LAB_0015eae5:
    pcStack_fd8 = (code *)0x15eaea;
    run_test_fs_link_cold_16();
LAB_0015eaea:
    pcStack_fd8 = (code *)0x15eaef;
    run_test_fs_link_cold_17();
LAB_0015eaef:
    pcStack_fd8 = (code *)0x15eaf4;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar14 = pcStack_f68;
    if ((long)pcStack_f68 < 0) goto LAB_0015ea9f;
    pcStack_fd8 = (code *)0x15e77f;
    uv_fs_req_cleanup(acStack_fc0);
    pcStack_fd8 = (code *)0x15e790;
    uVar24 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_fd0 = 0;
    pcVar21 = (char *)0x0;
    pcStack_fd8 = (code *)0x15e7c6;
    iov = uVar24;
    iVar4 = uv_fs_write(0,acStack_fc0,(ulong)pcVar18 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar14 = pcVar18;
    if (iVar4 != 0xd) goto LAB_0015eaa4;
    if (pcStack_f68 != (char *)0xd) goto LAB_0015eaa9;
    pcStack_fd8 = (code *)0x15e7e8;
    uv_fs_req_cleanup(acStack_fc0);
    pcStack_fd8 = (code *)0x15e7fb;
    uv_fs_close(loop,acStack_fc0,(ulong)pcVar18 & 0xffffffff,0);
    pcVar21 = (char *)0x0;
    pcStack_fd8 = (code *)0x15e816;
    iVar4 = uv_fs_link(0,acStack_fc0,"test_file","test_file_link",0);
    if (iVar4 != 0) goto LAB_0015eaae;
    if (pcStack_f68 != (char *)0x0) goto LAB_0015eab3;
    pcStack_fd8 = (code *)0x15e837;
    uv_fs_req_cleanup();
    pcVar21 = (char *)0x0;
    pcStack_fd8 = (code *)0x15e853;
    iVar4 = uv_fs_open(0,acStack_fc0,"test_file_link",2,0,0);
    pcVar18 = pcStack_f68;
    pcVar14 = acStack_fc0;
    if (iVar4 < 0) goto LAB_0015eab8;
    if ((long)pcStack_f68 < 0) goto LAB_0015eabd;
    pcStack_fd8 = (code *)0x15e876;
    uv_fs_req_cleanup(acStack_fc0);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_fd8 = (code *)0x15e898;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_fd0 = 0;
    pcVar21 = (char *)0x0;
    pcStack_fd8 = (code *)0x15e8ca;
    iov = uVar24;
    iVar4 = uv_fs_read(0,acStack_fc0,(ulong)pcVar18 & 0xffffffff,&iov,1,0);
    if (iVar4 < 0) goto LAB_0015eac2;
    if ((long)pcStack_f68 < 0) goto LAB_0015eac7;
    pcVar21 = buf;
    pcStack_fd8 = (code *)0x15e8f1;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_0015eacc;
    pcStack_fd8 = (code *)0x15e900;
    close((int)pcVar18);
    pcStack_fd8 = (code *)0x15e926;
    pcVar21 = (char *)loop;
    iVar4 = uv_fs_link(loop,acStack_fc0,"test_file","test_file_link2",link_cb);
    if (iVar4 != 0) goto LAB_0015ead1;
    pcStack_fd8 = (code *)0x15e93c;
    pcVar21 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_0015ead6;
    pcVar21 = (char *)0x0;
    pcStack_fd8 = (code *)0x15e967;
    iVar4 = uv_fs_open(0,acStack_fc0,"test_file_link2",2,0,0);
    pcVar14 = pcStack_f68;
    if (iVar4 < 0) goto LAB_0015eadb;
    if ((long)pcStack_f68 < 0) goto LAB_0015eae0;
    pcStack_fd8 = (code *)0x15e98a;
    uv_fs_req_cleanup(acStack_fc0);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_fd8 = (code *)0x15e9ac;
    uVar24 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_fd0 = 0;
    pcVar21 = (char *)0x0;
    pcStack_fd8 = (code *)0x15e9de;
    iov = uVar24;
    iVar4 = uv_fs_read(0,acStack_fc0,(ulong)pcVar14 & 0xffffffff,&iov,1,0);
    if (iVar4 < 0) goto LAB_0015eae5;
    if ((long)pcStack_f68 < 0) goto LAB_0015eaea;
    pcVar21 = buf;
    pcStack_fd8 = (code *)0x15ea05;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_0015eaef;
    pcStack_fd8 = (code *)0x15ea22;
    uv_fs_close(loop,acStack_fc0,(ulong)pcVar14 & 0xffffffff,0);
    pcStack_fd8 = (code *)0x15ea30;
    uv_run(loop,0);
    pcStack_fd8 = (code *)0x15ea3c;
    unlink("test_file");
    pcStack_fd8 = (code *)0x15ea48;
    unlink("test_file_link");
    pcStack_fd8 = (code *)0x15ea54;
    unlink("test_file_link2");
    pcStack_fd8 = (code *)0x15ea59;
    pcVar14 = (char *)uv_default_loop();
    pcStack_fd8 = (code *)0x15ea6d;
    uv_walk(pcVar14,close_walk_cb,0);
    pcStack_fd8 = (code *)0x15ea77;
    uv_run(pcVar14,0);
    pcStack_fd8 = (code *)0x15ea7c;
    pcVar21 = (char *)uv_default_loop();
    pcStack_fd8 = (code *)0x15ea84;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      pcStack_fd8 = (code *)0x15ea8d;
      uv_library_shutdown();
      return;
    }
  }
  pcStack_fd8 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar21)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar21)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_fe0 = (code *)0x15eb18;
    link_cb_cold_1();
  }
  pcStack_fe0 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_fe0 = (code *)pcVar14;
  loop = (uv_loop_t *)uv_default_loop();
  iVar4 = uv_fs_readlink(loop,auStack_1198,"no_such_file",dummy_cb);
  if (iVar4 == 0) {
    iVar4 = uv_run(loop,0);
    if (iVar4 != 0) goto LAB_0015ec1b;
    if (dummy_cb_count != 1) goto LAB_0015ec20;
    if (lStack_1138 != 0) goto LAB_0015ec25;
    if (lStack_1140 != -2) goto LAB_0015ec2a;
    uv_fs_req_cleanup(auStack_1198);
    iVar4 = uv_fs_readlink(0,auStack_1198,"no_such_file",0);
    if (iVar4 != -2) goto LAB_0015ec2f;
    if (lStack_1138 != 0) goto LAB_0015ec34;
    if (lStack_1140 == -2) {
      uv_fs_req_cleanup(auStack_1198);
      uVar11 = uv_default_loop();
      uv_walk(uVar11,close_walk_cb,0);
      uv_run(uVar11,0);
      uVar11 = uv_default_loop();
      iVar4 = uv_loop_close(uVar11);
      if (iVar4 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0015ec3e;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_0015ec1b:
    run_test_fs_readlink_cold_2();
LAB_0015ec20:
    run_test_fs_readlink_cold_3();
LAB_0015ec25:
    run_test_fs_readlink_cold_4();
LAB_0015ec2a:
    run_test_fs_readlink_cold_5();
LAB_0015ec2f:
    run_test_fs_readlink_cold_6();
LAB_0015ec34:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015ec3e:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void sendfile_nodata_cb(uv_fs_t* req) {
  ASSERT(req == &sendfile_req);
  ASSERT(req->fs_type == UV_FS_SENDFILE);
  ASSERT(req->result == 0);
  sendfile_cb_count++;
  uv_fs_req_cleanup(req);
}